

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluShaderProgram.cpp
# Opt level: O3

void __thiscall
glu::ShaderProgram::ShaderProgram
          (ShaderProgram *this,RenderContext *renderCtx,ProgramSources *sources)

{
  int iVar1;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  
  memset(this,0,0x90);
  iVar1 = (*renderCtx->_vptr_RenderContext[3])(renderCtx);
  Program::Program(&this->m_program,(Functions *)CONCAT44(extraout_var,iVar1));
  iVar1 = (*renderCtx->_vptr_RenderContext[3])(renderCtx);
  init(this,(EVP_PKEY_CTX *)CONCAT44(extraout_var_00,iVar1));
  return;
}

Assistant:

ShaderProgram::ShaderProgram (const RenderContext& renderCtx, const ProgramSources& sources)
	: m_program(renderCtx.getFunctions())
{
	init(renderCtx.getFunctions(), sources);
}